

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tape.cpp
# Opt level: O2

void __thiscall
Storage::Tape::TapePlayer::set_tape(TapePlayer *this,shared_ptr<Storage::Tape::Tape> *tape)

{
  std::__shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->tape_).super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>,
             &tape->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>);
  TimedEventLoop::reset_timer(&this->super_TimedEventLoop);
  get_next_pulse(this);
  ClockingHint::Source::update_clocking_observer(&this->super_Source);
  return;
}

Assistant:

void TapePlayer::set_tape(std::shared_ptr<Storage::Tape::Tape> tape) {
	tape_ = tape;
	reset_timer();
	get_next_pulse();
	update_clocking_observer();
}